

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

bool __thiscall QtMWidgets::SwitchPrivate::isChecked(SwitchPrivate *this)

{
  SwitchPrivate *this_local;
  
  if (this->state < NotAcceptedCheck) {
    this_local._7_1_ = false;
  }
  else if (this->state - NotAcceptedCheck < 2) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
SwitchPrivate::isChecked() const
{
	switch( state )
	{
		case Switch::NotAcceptedUncheck :
		case Switch::AcceptedUncheck :
			return false;

		case Switch::NotAcceptedCheck :
		case Switch::AcceptedCheck :
			return true;

		default :
			return false;
	}
}